

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O2

void __thiscall list_files::~list_files(list_files *this)

{
  (this->super_action)._vptr_action = (_func_int **)&PTR__list_files_00141fd0;
  std::__cxx11::string::~string((string *)&this->_fsname);
  return;
}

Assistant:

virtual ~list_files() { }